

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wavelet.cpp
# Opt level: O3

void idx2::ForwardCdf53(v3i *Dims3,v3i *M3,int Iter,int NLevels,u64 TformOrder,volume *Vol,
                       bool Normalize)

{
  v3i *N3;
  uint uVar1;
  undefined1 *puVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  u64 TransformOrder;
  long lVar8;
  grid *Grid;
  undefined1 auVar9 [16];
  double dVar10;
  grid G;
  v3i R3;
  v3i D3;
  v3i S3;
  grid_iterator<signed_char> ItEnd;
  wav_basis_norms_static<16> BasisNorms;
  grid_iterator<double> local_240;
  int local_204;
  grid local_200;
  ulong local_1e8;
  uint local_1e0;
  ulong local_1d8;
  uint local_1d0;
  int local_1c8;
  ulong local_1c4;
  uint local_1bc;
  grid_iterator<double> local_1b8;
  v3i *local_180;
  array<idx2::subband> local_178;
  undefined1 local_140 [136];
  undefined1 local_b8 [136];
  double dVar11;
  double dVar12;
  
  local_1c8 = Iter;
  local_1d0 = (Dims3->field_0).field_0.Z;
  local_1d8 = *(ulong *)&Dims3->field_0;
  local_1e0 = (Dims3->field_0).field_0.Z;
  local_1e8 = *(ulong *)&Dims3->field_0;
  local_1c4 = 0x100000001;
  local_1bc = 1;
  local_200.super_extent.From = 0;
  local_200.super_extent.Dims =
       (ulong)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Dims3->field_0).field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Dims3->field_0).field_0.X & 0x1fffff;
  local_200.Strd = 0x40000200001;
  if (0 < NLevels) {
    local_180 = Dims3;
    iVar6 = 0;
    TransformOrder = TformOrder;
    local_204 = NLevels;
    do {
      uVar7 = (uint)TransformOrder;
      uVar1 = uVar7 & 3;
      TransformOrder = TransformOrder >> 2;
      if (uVar1 == 3) {
        if (TransformOrder != 3) {
          TformOrder = TransformOrder;
        }
        local_200.Strd =
             (ulong)(local_1bc & 0x1fffff) << 0x2a |
             (local_1c4 >> 0x20 & 0x1fffff) << 0x15 | local_1c4 & 0x1fffff;
        local_1e0 = local_1d0;
        local_200.super_extent.Dims =
             (ulong)(local_1d0 & 0x1fffff) << 0x2a |
             (local_1d8 >> 0x20 & 0x1fffff) << 0x15 | local_1d8 & 0x1fffff;
        local_1e8 = local_1d8;
        iVar6 = iVar6 + 1;
        TransformOrder = TformOrder;
      }
      else {
        switch(Vol->Type) {
        case int8:
          if (uVar1 == 2) {
            FLiftCdf53Z<signed_char>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<signed_char>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<signed_char>(&local_200,M3,Normal,Vol);
          }
          break;
        case uint8:
          if (uVar1 == 2) {
            FLiftCdf53Z<unsigned_char>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<unsigned_char>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_char>(&local_200,M3,Normal,Vol);
          }
          break;
        case int16:
          if (uVar1 == 2) {
            FLiftCdf53Z<short>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<short>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<short>(&local_200,M3,Normal,Vol);
          }
          break;
        case uint16:
          if (uVar1 == 2) {
            FLiftCdf53Z<unsigned_short>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<unsigned_short>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_short>(&local_200,M3,Normal,Vol);
          }
          break;
        case int32:
          if (uVar1 == 2) {
            FLiftCdf53Z<int>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<int>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<int>(&local_200,M3,Normal,Vol);
          }
          break;
        case uint32:
          if (uVar1 == 2) {
            FLiftCdf53Z<unsigned_int>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<unsigned_int>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_int>(&local_200,M3,Normal,Vol);
          }
          break;
        case int64:
          if (uVar1 == 2) {
            FLiftCdf53Z<long>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<long>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<long>(&local_200,M3,Normal,Vol);
          }
          break;
        case uint64:
          if (uVar1 == 2) {
            FLiftCdf53Z<unsigned_long>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<unsigned_long>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<unsigned_long>(&local_200,M3,Normal,Vol);
          }
          break;
        case float32:
          if (uVar1 == 2) {
            FLiftCdf53Z<float>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<float>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<float>(&local_200,M3,Normal,Vol);
          }
          break;
        case float64:
          if (uVar1 == 2) {
            FLiftCdf53Z<double>(&local_200,M3,Normal,Vol);
          }
          else if (uVar1 == 1) {
            FLiftCdf53Y<double>(&local_200,M3,Normal,Vol);
          }
          else {
            FLiftCdf53X<double>(&local_200,M3,Normal,Vol);
          }
        }
        uVar5 = (ulong)((uVar7 & 3) << 2);
        uVar1 = *(uint *)((long)&local_1d8 + uVar5) | 1;
        *(uint *)((long)&local_1e8 + uVar5) = uVar1;
        local_200.super_extent.Dims =
             (ulong)(local_1e0 & 0x1fffff) << 0x2a |
             (local_1e8 >> 0x20 & 0x1fffff) << 0x15 | local_1e8 & 0x1fffff;
        *(int *)((long)&local_1d8 + uVar5) = (int)(uVar1 + 1) >> 1;
        *(int *)((long)&local_1c4 + uVar5) = *(int *)((long)&local_1c4 + uVar5) << 1;
      }
      N3 = local_180;
    } while (iVar6 < local_204);
    if (Normalize && 0 < local_204) {
      if (Mallocator()::Instance == '\0') {
        ForwardCdf53();
      }
      if (Mallocator()::Instance == '\0') {
        ForwardCdf53();
      }
      local_178.Buffer.Data = (byte *)0x0;
      local_178.Buffer.Bytes = 0;
      local_178.Buffer.Alloc = (allocator *)&Mallocator()::Instance;
      local_178.Size = 0;
      local_178.Capacity = 0;
      local_178.Alloc = (allocator *)&Mallocator()::Instance;
      BuildSubbands(N3,local_204,TransformOrder,&local_178);
      GetCdf53NormsFast<16>();
      if (0 < local_178.Size) {
        local_204 = local_204 * local_1c8;
        lVar8 = 0;
        do {
          dVar12 = 1.0;
          dVar11 = 1.0;
          dVar10 = 1.0;
          Grid = (grid *)(local_178.Buffer.Data + lVar8 * 0x40);
          if ((N3->field_0).field_0.X != 1) {
            iVar6 = *(char *)((long)&Grid[2].super_extent.From + 3) + local_204;
            if (*(char *)((long)&Grid[2].super_extent.From + 6) == '\0') {
              if (0x10 < iVar6) goto LAB_0018c1bd;
              iVar6 = iVar6 + -1;
              puVar2 = local_140;
            }
            else {
              puVar2 = local_b8;
              if (0xf < iVar6) goto LAB_0018c1bd;
            }
            dVar10 = *(double *)(puVar2 + (long)iVar6 * 8);
          }
          if ((N3->field_0).field_0.Y != 1) {
            iVar6 = *(char *)((long)&Grid[2].super_extent.From + 4) + local_204;
            if (*(char *)((long)&Grid[2].super_extent.From + 7) == '\0') {
              if (0x10 < iVar6) goto LAB_0018c1bd;
              iVar6 = iVar6 + -1;
              puVar2 = local_140;
            }
            else {
              puVar2 = local_b8;
              if (0xf < iVar6) goto LAB_0018c1bd;
            }
            dVar11 = *(double *)(puVar2 + (long)iVar6 * 8);
          }
          if ((N3->field_0).field_0.Z != 1) {
            iVar6 = *(char *)((long)&Grid[2].super_extent.From + 5) + local_204;
            if ((char)Grid[2].super_extent.Dims == '\0') {
              if (0x10 < iVar6) goto LAB_0018c1bd;
              iVar6 = iVar6 + -1;
              puVar2 = local_140;
            }
            else {
              puVar2 = local_b8;
              if (0xf < iVar6) {
LAB_0018c1bd:
                __assert_fail("Idx < N",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                              ,0x20c,
                              "t &idx2::stack_array<double, 16>::operator[](int) const [t = double, N = 16]"
                             );
              }
            }
            dVar12 = *(double *)(puVar2 + (long)iVar6 * 8);
          }
          if (Vol->Type < __Invalid__) {
            dVar12 = dVar10 * dVar11 * dVar12;
            switch(Vol->Type) {
            case int8:
              End<signed_char>((grid_iterator<signed_char> *)&local_1b8,Grid,Vol);
              Begin<signed_char>((grid_iterator<signed_char> *)&local_240,Grid,Vol);
              while (local_240.Ptr != local_1b8.Ptr) {
                *(char *)local_240.Ptr = (char)(int)((double)(int)*(char *)local_240.Ptr * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                local_240.Ptr =
                     (double *)((long)local_240.S.field_0.field_0.X + (long)local_240.Ptr);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  local_240.Ptr =
                       (double *)
                       ((long)local_240.Ptr +
                       (local_240.S.field_0.field_0.Y * lVar4 - (long)local_240.D.field_0.field_0.X)
                       );
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    local_240.Ptr =
                         (double *)
                         ((long)local_240.Ptr +
                         ((long)local_240.N.field_0.field_0.Y *
                          local_240.S.field_0.field_0.Z * lVar4 -
                         local_240.D.field_0.field_0.Y * lVar4));
                  }
                }
              }
              break;
            case uint8:
              End<unsigned_char>((grid_iterator<unsigned_char> *)&local_1b8,Grid,Vol);
              Begin<unsigned_char>((grid_iterator<unsigned_char> *)&local_240,Grid,Vol);
              while (local_240.Ptr != local_1b8.Ptr) {
                *(char *)local_240.Ptr = (char)(int)((double)*(byte *)local_240.Ptr * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                local_240.Ptr =
                     (double *)((long)local_240.S.field_0.field_0.X + (long)local_240.Ptr);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  local_240.Ptr =
                       (double *)
                       ((long)local_240.Ptr +
                       (local_240.S.field_0.field_0.Y * lVar4 - (long)local_240.D.field_0.field_0.X)
                       );
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    local_240.Ptr =
                         (double *)
                         ((long)local_240.Ptr +
                         ((long)local_240.N.field_0.field_0.Y *
                          local_240.S.field_0.field_0.Z * lVar4 -
                         local_240.D.field_0.field_0.Y * lVar4));
                  }
                }
              }
              break;
            case int16:
              End<short>((grid_iterator<short> *)&local_1b8,Grid,Vol);
              Begin<short>((grid_iterator<short> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *(short *)pdVar3 = (short)(int)((double)(int)*(short *)pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = (double *)((long)pdVar3 + (long)local_240.S.field_0.field_0.X * 2);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = (double *)
                           ((long)pdVar3 +
                           local_240.S.field_0.field_0.Y * lVar4 * 2 +
                           (long)local_240.D.field_0.field_0.X * -2);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = (double *)
                             ((long)pdVar3 +
                             (long)local_240.N.field_0.field_0.Y *
                             local_240.S.field_0.field_0.Z * lVar4 * 2 +
                             local_240.D.field_0.field_0.Y * lVar4 * -2);
                  }
                }
              }
              break;
            case uint16:
              End<unsigned_short>((grid_iterator<unsigned_short> *)&local_1b8,Grid,Vol);
              Begin<unsigned_short>((grid_iterator<unsigned_short> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *(short *)pdVar3 = (short)(int)((double)*(ushort *)pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = (double *)((long)pdVar3 + (long)local_240.S.field_0.field_0.X * 2);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = (double *)
                           ((long)pdVar3 +
                           local_240.S.field_0.field_0.Y * lVar4 * 2 +
                           (long)local_240.D.field_0.field_0.X * -2);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = (double *)
                             ((long)pdVar3 +
                             (long)local_240.N.field_0.field_0.Y *
                             local_240.S.field_0.field_0.Z * lVar4 * 2 +
                             local_240.D.field_0.field_0.Y * lVar4 * -2);
                  }
                }
              }
              break;
            case int32:
              End<int>((grid_iterator<int> *)&local_1b8,Grid,Vol);
              Begin<int>((grid_iterator<int> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *(int *)pdVar3 = (int)((double)(int)*(float *)pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = (double *)((long)pdVar3 + (long)local_240.S.field_0.field_0.X * 4);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = (double *)
                           ((long)pdVar3 +
                           local_240.S.field_0.field_0.Y * lVar4 * 4 +
                           (long)local_240.D.field_0.field_0.X * -4);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = (double *)
                             ((long)pdVar3 +
                             (long)local_240.N.field_0.field_0.Y *
                             local_240.S.field_0.field_0.Z * lVar4 * 4 +
                             local_240.D.field_0.field_0.Y * lVar4 * -4);
                  }
                }
              }
              break;
            case uint32:
              End<unsigned_int>((grid_iterator<unsigned_int> *)&local_1b8,Grid,Vol);
              Begin<unsigned_int>((grid_iterator<unsigned_int> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *(float *)pdVar3 = (float)(long)((double)(uint)*(float *)pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = (double *)((long)pdVar3 + (long)local_240.S.field_0.field_0.X * 4);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = (double *)
                           ((long)pdVar3 +
                           local_240.S.field_0.field_0.Y * lVar4 * 4 +
                           (long)local_240.D.field_0.field_0.X * -4);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = (double *)
                             ((long)pdVar3 +
                             (long)local_240.N.field_0.field_0.Y *
                             local_240.S.field_0.field_0.Z * lVar4 * 4 +
                             local_240.D.field_0.field_0.Y * lVar4 * -4);
                  }
                }
              }
              break;
            case int64:
              End<long>((grid_iterator<long> *)&local_1b8,Grid,Vol);
              Begin<long>((grid_iterator<long> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *pdVar3 = (double)(long)((double)(long)*pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = pdVar3 + local_240.S.field_0.field_0.X;
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = pdVar3 + (local_240.S.field_0.field_0.Y * lVar4 -
                                    (long)local_240.D.field_0.field_0.X);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = pdVar3 + ((long)local_240.N.field_0.field_0.Y *
                                       local_240.S.field_0.field_0.Z * lVar4 -
                                      local_240.D.field_0.field_0.Y * lVar4);
                  }
                }
              }
              break;
            case uint64:
              End<unsigned_long>((grid_iterator<unsigned_long> *)&local_1b8,Grid,Vol);
              Begin<unsigned_long>((grid_iterator<unsigned_long> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                auVar9._8_8_ = 0;
                auVar9._0_8_ = *pdVar3;
                auVar9 = vunpcklps_avx(auVar9,_DAT_001a8f60);
                auVar9 = vsubpd_avx(auVar9,_DAT_001a8f70);
                dVar10 = (auVar9._0_8_ + auVar9._8_8_) * dVar12;
                uVar5 = (ulong)dVar10;
                *pdVar3 = (double)((long)(dVar10 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f |
                                  uVar5);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = pdVar3 + local_240.S.field_0.field_0.X;
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = pdVar3 + (local_240.S.field_0.field_0.Y * lVar4 -
                                    (long)local_240.D.field_0.field_0.X);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = pdVar3 + ((long)local_240.N.field_0.field_0.Y *
                                       local_240.S.field_0.field_0.Z * lVar4 -
                                      local_240.D.field_0.field_0.Y * lVar4);
                  }
                }
              }
              break;
            case float32:
              End<float>((grid_iterator<float> *)&local_1b8,Grid,Vol);
              Begin<float>((grid_iterator<float> *)&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *(float *)pdVar3 = (float)((double)*(float *)pdVar3 * dVar12);
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = (double *)((long)pdVar3 + (long)local_240.S.field_0.field_0.X * 4);
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = (double *)
                           ((long)pdVar3 +
                           local_240.S.field_0.field_0.Y * lVar4 * 4 +
                           (long)local_240.D.field_0.field_0.X * -4);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = (double *)
                             ((long)pdVar3 +
                             (long)local_240.N.field_0.field_0.Y *
                             local_240.S.field_0.field_0.Z * lVar4 * 4 +
                             local_240.D.field_0.field_0.Y * lVar4 * -4);
                  }
                }
              }
              break;
            case float64:
              End<double>(&local_1b8,Grid,Vol);
              Begin<double>(&local_240,Grid,Vol);
              pdVar3 = local_240.Ptr;
              while (pdVar3 != local_1b8.Ptr) {
                *pdVar3 = dVar12 * *pdVar3;
                local_240.P.field_0.field_0.X =
                     local_240.P.field_0.field_0.X + local_240.S.field_0.field_0.X;
                pdVar3 = pdVar3 + local_240.S.field_0.field_0.X;
                if (local_240.D.field_0.field_0.X <= local_240.P.field_0.field_0.X) {
                  local_240.P.field_0.field_0.X = 0;
                  local_240.P.field_0.field_0.Y =
                       local_240.P.field_0.field_0.Y + local_240.S.field_0.field_0.Y;
                  lVar4 = (long)local_240.N.field_0.field_0.X;
                  pdVar3 = pdVar3 + (local_240.S.field_0.field_0.Y * lVar4 -
                                    (long)local_240.D.field_0.field_0.X);
                  if (local_240.D.field_0.field_0.Y <= local_240.P.field_0.field_0.Y) {
                    local_240.P.field_0.field_0.Y = 0;
                    local_240.P.field_0.field_0.Z =
                         local_240.P.field_0.field_0.Z + local_240.S.field_0.field_0.Z;
                    pdVar3 = pdVar3 + ((long)local_240.N.field_0.field_0.Y *
                                       local_240.S.field_0.field_0.Z * lVar4 -
                                      local_240.D.field_0.field_0.Y * lVar4);
                  }
                }
              }
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < local_178.Size);
      }
      (*(local_178.Alloc)->_vptr_allocator[1])();
    }
  }
  return;
}

Assistant:

void
ForwardCdf53(const v3i& Dims3,
             const v3i& M3,
             int Iter,
             int NLevels,
             u64 TformOrder,
             volume* Vol,
             bool Normalize)
{
  idx2_Assert(Dims3 <= Dims(*Vol));
  int Level = 0;
  u64 PrevOrder = TformOrder;
  v3i D3 = Dims3;
  v3i R3 = D3;
  v3i S3(1);
  grid G(Dims3);
  while (Level < NLevels)
  {
    idx2_Assert(TformOrder != 0);
    int D = TformOrder & 0x3;
    TformOrder >>= 2;
    if (D == 3)
    {                      // next level
      if (TformOrder == 3) // next one is the last |
        TformOrder = PrevOrder;
      else
        PrevOrder = TformOrder;
      SetStrd(&G, S3);
      SetDims(&G, D3);
      R3 = D3;
      ++Level;
    }
    else
    {
#define Body(type)                                                                                 \
  switch (D)                                                                                       \
  {                                                                                                \
    case 0:                                                                                        \
      idx2_Assert(Dims3.X > 1);                                                                    \
      FLiftCdf53X<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 1:                                                                                        \
      idx2_Assert(Dims3.Y > 1);                                                                    \
      FLiftCdf53Y<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    case 2:                                                                                        \
      idx2_Assert(Dims3.Z > 1);                                                                    \
      FLiftCdf53Z<type>(G, M3, lift_option::Normal, Vol);                                          \
      break;                                                                                       \
    default:                                                                                       \
      idx2_Assert(false);                                                                          \
      break;                                                                                       \
  };
      idx2_DispatchOnType(Vol->Type);
#undef Body
      R3[D] = D3[D] + IsEven(D3[D]);
      SetDims(&G, R3);
      D3[D] = (R3[D] + 1) >> 1;
      S3[D] <<= 1;
    }
  }

  /* Optionally normalize */
  if (NLevels > 0 && Normalize)
  {
    idx2_Assert(IsFloatingPoint(Vol->Type));
    idx2_RAII(array<subband>, Subbands, BuildSubbands(Dims3, NLevels, TformOrder, &Subbands));
    auto BasisNorms = GetCdf53NormsFast<16>();
    for (int I = 0; I < Size(Subbands); ++I)
    {
      subband& S = Subbands[I];
      f64 Wx = Dims3.X == 1
                 ? 1
                 : (S.LowHigh3.X == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.X - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.X]);
      f64 Wy = Dims3.Y == 1
                 ? 1
                 : (S.LowHigh3.Y == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Y - 1]
                                      : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Y]);
      f64 Idx2 = Dims3.Z == 1
                   ? 1
                   : (S.LowHigh3.Z == 0 ? BasisNorms.ScalNorms[Iter * NLevels + S.Level3Rev.Z - 1]
                                        : BasisNorms.WaveNorms[Iter * NLevels + S.Level3Rev.Z]);
      f64 W = Wx * Wy * Idx2;
#define Body(type)                                                                                 \
  auto ItEnd = End<type>(S.Grid, *Vol);                                                            \
  for (auto It = Begin<type>(S.Grid, *Vol); It != ItEnd; ++It)                                     \
    *It = type(*It * W);
      idx2_DispatchOnType(Vol->Type);
#undef Body
    }
  }
}